

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O3

void duckdb::Node48::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  byte bVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  type paVar3;
  iterator iVar4;
  pointer this;
  data_ptr_t pdVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  Node node48;
  IndexPointer local_38;
  
  uVar6 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar3->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_38.data = uVar6 & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_38.data);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar8 = (ulong)((uint)(uVar6 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  bVar1 = pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar8];
  uVar6 = (ulong)bVar1;
  if (uVar6 == 0x30) {
    local_38.data = (node->super_IndexPointer).data;
    Node256::GrowNode48(art,node,(Node *)&local_38);
    Node256::InsertChild(art,node,byte,child);
  }
  else {
    pdVar5 = pdVar5 + (_Var2._M_head_impl)->bitmask_offset + lVar8;
    bVar7 = bVar1;
    if (pdVar5[uVar6 * 8 + 0x10f] != '\0') {
      bVar7 = 0xff;
      do {
        bVar7 = bVar7 + 1;
        uVar6 = (ulong)bVar7;
      } while (0xffffffffffffff < *(ulong *)(pdVar5 + uVar6 * 8 + 0x108));
    }
    ((IndexPointer *)(pdVar5 + uVar6 * 8 + 0x108))->data = (idx_t)child.super_IndexPointer.data;
    pdVar5[(ulong)byte + 1] = bVar7;
    *pdVar5 = bVar1 + 1;
  }
  return;
}

Assistant:

void Node48::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);

	// The node is full. Grow to Node256.
	if (n48.count == CAPACITY) {
		auto node48 = node;
		Node256::GrowNode48(art, node, node48);
		Node256::InsertChild(art, node, byte, child);
		return;
	}

	// Still space. Insert the child.
	uint8_t child_pos = n48.count;
	if (n48.children[child_pos].HasMetadata()) {
		// Find an empty position in the node list.
		child_pos = 0;
		while (n48.children[child_pos].HasMetadata()) {
			child_pos++;
		}
	}

	n48.children[child_pos] = child;
	n48.child_index[byte] = child_pos;
	n48.count++;
}